

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O0

void bn_mont_reduction_u64(uint32_t len,uint64_t *n,uint64_t nInv,uint64_t *c,uint64_t *res)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  undefined8 uStack_280;
  undefined1 auStack_278 [8];
  undefined1 *local_270;
  uint64_t x;
  uint64_t *os;
  uint32_t i_4;
  uint64_t c2;
  uint64_t c10;
  uint64_t *res_i_3;
  uint64_t t2_1;
  uint64_t t1_1;
  uint32_t i_3;
  uint64_t *res_i_2;
  uint64_t t2;
  uint64_t t12;
  uint64_t *res_i2_1;
  uint64_t t22;
  uint64_t t11;
  uint64_t *res_i1_1;
  uint64_t t21;
  uint64_t t10;
  uint64_t *res_i0_1;
  uint64_t t20;
  uint64_t t1;
  ulong uStack_1b8;
  uint32_t i_2;
  uint64_t c1;
  unsigned_long __vla_expr0;
  ulong local_1a0;
  uint64_t c00;
  uint64_t res_j;
  uint64_t *resb;
  uint64_t c10_1;
  uint64_t r;
  uint64_t *res_i_1;
  uint64_t a_i_1;
  uint64_t *puStack_160;
  uint32_t i_1;
  uint64_t *res_i;
  uint64_t a_i2;
  uint64_t *res_i2;
  uint64_t a_i1;
  uint64_t *res_i1;
  uint64_t a_i0;
  uint64_t *res_i0;
  uint64_t a_i;
  uint64_t *puStack_118;
  uint32_t i;
  uint64_t c1_1;
  uint64_t *res_j0;
  uint64_t qj;
  ulong uStack_f8;
  uint32_t i0;
  uint64_t c0;
  uint64_t *res_local;
  uint64_t *c_local;
  uint64_t nInv_local;
  uint64_t *n_local;
  uint64_t *puStack_c8;
  uint32_t len_local;
  ulong local_c0;
  uint64_t *local_b8;
  char local_a9;
  
  uStack_f8 = 0;
  c0 = (uint64_t)res;
  res_local = c;
  c_local = (uint64_t *)nInv;
  nInv_local = (uint64_t)n;
  n_local._4_4_ = len;
  for (qj._4_4_ = 0; qj._4_4_ < n_local._4_4_; qj._4_4_ = qj._4_4_ + 1) {
    res_j0 = (uint64_t *)((long)c_local * res_local[qj._4_4_]);
    c1_1 = (uint64_t)(res_local + qj._4_4_);
    puStack_118 = (uint64_t *)0x0;
    for (a_i._4_4_ = 0; a_i._4_4_ < n_local._4_4_ >> 2; a_i._4_4_ = a_i._4_4_ + 1) {
      res_i0 = *(uint64_t **)(nInv_local + (ulong)(a_i._4_4_ << 2) * 8);
      a_i0 = c1_1 + (ulong)(a_i._4_4_ << 2) * 8;
      uStack_280 = 0x1df5b9;
      puStack_118 = (uint64_t *)
                    Hacl_Bignum_Base_mul_wide_add2_u64
                              ((uint64_t)res_i0,(uint64_t)res_j0,(uint64_t)puStack_118,
                               (uint64_t *)a_i0);
      res_i1 = *(uint64_t **)(nInv_local + (ulong)(a_i._4_4_ * 4 + 1) * 8);
      a_i1 = c1_1 + (ulong)(a_i._4_4_ << 2) * 8 + 8;
      uStack_280 = 0x1df625;
      puStack_118 = (uint64_t *)
                    Hacl_Bignum_Base_mul_wide_add2_u64
                              ((uint64_t)res_i1,(uint64_t)res_j0,(uint64_t)puStack_118,
                               (uint64_t *)a_i1);
      res_i2 = *(uint64_t **)(nInv_local + (ulong)(a_i._4_4_ * 4 + 2) * 8);
      a_i2 = c1_1 + (ulong)(a_i._4_4_ << 2) * 8 + 0x10;
      uStack_280 = 0x1df691;
      puStack_118 = (uint64_t *)
                    Hacl_Bignum_Base_mul_wide_add2_u64
                              ((uint64_t)res_i2,(uint64_t)res_j0,(uint64_t)puStack_118,
                               (uint64_t *)a_i2);
      res_i = *(uint64_t **)(nInv_local + (ulong)(a_i._4_4_ * 4 + 3) * 8);
      puStack_160 = (uint64_t *)(c1_1 + (ulong)(a_i._4_4_ << 2) * 8 + 0x18);
      uStack_280 = 0x1df6fd;
      puStack_118 = (uint64_t *)
                    Hacl_Bignum_Base_mul_wide_add2_u64
                              ((uint64_t)res_i,(uint64_t)res_j0,(uint64_t)puStack_118,puStack_160);
    }
    for (a_i_1._4_4_ = n_local._4_4_ & 0xfffffffc; a_i_1._4_4_ < n_local._4_4_;
        a_i_1._4_4_ = a_i_1._4_4_ + 1) {
      res_i_1 = *(uint64_t **)(nInv_local + (ulong)a_i_1._4_4_ * 8);
      r = c1_1 + (ulong)a_i_1._4_4_ * 8;
      uStack_280 = 0x1df78c;
      puStack_118 = (uint64_t *)
                    Hacl_Bignum_Base_mul_wide_add2_u64
                              ((uint64_t)res_i_1,(uint64_t)res_j0,(uint64_t)puStack_118,
                               (uint64_t *)r);
    }
    c10_1 = (uint64_t)puStack_118;
    resb = puStack_118;
    res_j = (uint64_t)(res_local + (ulong)n_local._4_4_ + (ulong)qj._4_4_);
    c00 = res_local[n_local._4_4_ + qj._4_4_];
    local_a9 = (char)uStack_f8;
    local_b8 = puStack_118;
    *(uint64_t *)res_j = (long)puStack_118 + c00 + (ulong)(local_a9 != '\0');
    uStack_f8 = (ulong)(CARRY8((ulong)puStack_118,c00) ||
                       CARRY8((long)puStack_118 + c00,(ulong)(local_a9 != '\0')));
    puStack_c8 = (uint64_t *)res_j;
    local_c0 = c00;
  }
  uStack_280 = 0x1df8c4;
  memcpy((void *)c0,res_local + n_local._4_4_,(ulong)n_local._4_4_ << 3);
  local_1a0 = uStack_f8;
  if (0x1fffffffffffffff < (ulong)n_local._4_4_) {
    uStack_280 = 0x1df901;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
           ,0x440);
    uStack_280 = 0x1df90b;
    exit(0xfd);
  }
  c1 = (uint64_t)n_local._4_4_;
  lVar6 = -(c1 * 8 + 0xf & 0xfffffffffffffff0);
  uVar8 = (ulong)n_local._4_4_;
  local_270 = auStack_278 + lVar6;
  __vla_expr0 = (unsigned_long)auStack_278;
  *(undefined8 *)(auStack_278 + lVar6 + -8) = 0x1df953;
  memset(auStack_278 + lVar6,0,uVar8 << 3);
  uStack_1b8 = 0;
  for (t1._4_4_ = 0; puVar7 = local_270, t1._4_4_ < n_local._4_4_ >> 2; t1._4_4_ = t1._4_4_ + 1) {
    uVar8 = *(ulong *)(c0 + (ulong)(t1._4_4_ << 2) * 8);
    uVar1 = *(ulong *)(nInv_local + (ulong)(t1._4_4_ << 2) * 8);
    uVar4 = (ulong)((char)uStack_1b8 != '\0');
    uVar5 = uVar8 - uVar1;
    *(ulong *)(local_270 + (ulong)(t1._4_4_ << 2) * 8) = uVar5 - uVar4;
    uVar2 = *(ulong *)(c0 + (ulong)(t1._4_4_ * 4 + 1) * 8);
    uVar3 = *(ulong *)(nInv_local + (ulong)(t1._4_4_ * 4 + 1) * 8);
    uVar4 = (ulong)(uVar8 < uVar1 || uVar5 < uVar4);
    uVar5 = uVar2 - uVar3;
    *(ulong *)(puVar7 + (ulong)(t1._4_4_ << 2) * 8 + 8) = uVar5 - uVar4;
    uVar8 = *(ulong *)(c0 + (ulong)(t1._4_4_ * 4 + 2) * 8);
    uVar1 = *(ulong *)(nInv_local + (ulong)(t1._4_4_ * 4 + 2) * 8);
    uVar4 = (ulong)(uVar2 < uVar3 || uVar5 < uVar4);
    uVar5 = uVar8 - uVar1;
    *(ulong *)(puVar7 + (ulong)(t1._4_4_ << 2) * 8 + 0x10) = uVar5 - uVar4;
    uVar2 = *(ulong *)(c0 + (ulong)(t1._4_4_ * 4 + 3) * 8);
    uVar3 = *(ulong *)(nInv_local + (ulong)(t1._4_4_ * 4 + 3) * 8);
    uVar8 = (ulong)(uVar8 < uVar1 || uVar5 < uVar4);
    uVar1 = uVar2 - uVar3;
    *(ulong *)(puVar7 + (ulong)(t1._4_4_ << 2) * 8 + 0x18) = uVar1 - uVar8;
    uStack_1b8 = (ulong)(uVar2 < uVar3 || uVar1 < uVar8);
  }
  for (t1_1._4_4_ = n_local._4_4_ & 0xfffffffc; t1_1._4_4_ < n_local._4_4_;
      t1_1._4_4_ = t1_1._4_4_ + 1) {
    uVar8 = *(ulong *)(c0 + (ulong)t1_1._4_4_ * 8);
    uVar1 = *(ulong *)(nInv_local + (ulong)t1_1._4_4_ * 8);
    uVar2 = (ulong)((char)uStack_1b8 != '\0');
    uVar3 = uVar8 - uVar1;
    *(ulong *)(local_270 + (ulong)t1_1._4_4_ * 8) = uVar3 - uVar2;
    uStack_1b8 = (ulong)(uVar8 < uVar1 || uVar3 < uVar2);
  }
  for (os._4_4_ = 0; os._4_4_ < n_local._4_4_; os._4_4_ = os._4_4_ + 1) {
    *(ulong *)(c0 + (ulong)os._4_4_ * 8) =
         local_1a0 - uStack_1b8 & *(ulong *)(c0 + (ulong)os._4_4_ * 8) |
         (local_1a0 - uStack_1b8 ^ 0xffffffffffffffff) & *(ulong *)(local_270 + (ulong)os._4_4_ * 8)
    ;
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u64(uint32_t len, uint64_t *n, uint64_t nInv, uint64_t *c, uint64_t *res)
{
  uint64_t c0 = 0ULL;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint64_t qj = nInv * c[i0];
    uint64_t *res_j0 = c + i0;
    uint64_t c1 = 0ULL;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint64_t a_i = n[4U * i];
      uint64_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i0);
      uint64_t a_i0 = n[4U * i + 1U];
      uint64_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, qj, c1, res_i1);
      uint64_t a_i1 = n[4U * i + 2U];
      uint64_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, qj, c1, res_i2);
      uint64_t a_i2 = n[4U * i + 3U];
      uint64_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint64_t a_i = n[i];
      uint64_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i);
    }
    uint64_t r = c1;
    uint64_t c10 = r;
    uint64_t *resb = c + len + i0;
    uint64_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u64(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint64_t));
  uint64_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t c1 = 0ULL;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint64_t t1 = res[4U * i];
    uint64_t t20 = n[4U * i];
    uint64_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t20, res_i0);
    uint64_t t10 = res[4U * i + 1U];
    uint64_t t21 = n[4U * i + 1U];
    uint64_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t10, t21, res_i1);
    uint64_t t11 = res[4U * i + 2U];
    uint64_t t22 = n[4U * i + 2U];
    uint64_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t11, t22, res_i2);
    uint64_t t12 = res[4U * i + 3U];
    uint64_t t2 = n[4U * i + 3U];
    uint64_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint64_t t1 = res[i];
    uint64_t t2 = n[i];
    uint64_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t2, res_i);
  }
  uint64_t c10 = c1;
  uint64_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t *os = res;
    uint64_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}